

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_rangeproof_rewind_inner
              (secp256k1_scalar *blind,uint64_t *v,uchar *m,size_t *mlen,secp256k1_scalar *ev,
              secp256k1_scalar *s,size_t *rsizes,size_t rings,uchar *nonce,secp256k1_ge *commit,
              uchar *proof,size_t len,secp256k1_ge *genp)

{
  ulong uVar1;
  size_t sVar2;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  secp256k1_scalar *r;
  uchar *puVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  uchar tmp [32];
  secp256k1_scalar stmp;
  secp256k1_scalar stmp_1;
  secp256k1_scalar sec [32];
  uchar prep [4096];
  secp256k1_scalar s_orig [128];
  byte local_24a8;
  undefined7 uStack_24a7;
  uint64_t uStack_24a0;
  uint64_t local_2498;
  uint64_t auStack_2490 [2];
  uchar *local_2480;
  secp256k1_scalar local_2478;
  secp256k1_scalar local_2458;
  secp256k1_scalar local_2438 [27];
  undefined1 auStack_20d8 [160];
  uchar local_2038 [8];
  uint64_t auStack_2030 [511];
  secp256k1_scalar local_1038 [128];
  
  local_2480 = m;
  memset(local_2038,0,0x1000);
  secp256k1_rangeproof_genrand
            (local_2438,local_1038,local_2038,rsizes,rings,nonce,commit,proof,len,genp);
  *v = 0xffffffffffffffff;
  blind->d[0] = 0;
  blind->d[1] = 0;
  blind->d[2] = 0;
  blind->d[3] = 0;
  if ((rings == 1) && (*rsizes == 1)) {
    secp256k1_scalar_negate(blind,s);
    secp256k1_scalar_add(blind,blind,local_1038);
    secp256k1_scalar_inverse(&local_2458,ev);
    secp256k1_scalar_mul(blind,blind,&local_2458);
    *v = 0;
    iVar3 = 1;
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
    }
  }
  else {
    uVar1 = rings * 4 - 4;
    puVar12 = auStack_20d8 + rings * 0x80;
    uVar7 = 0;
    uVar9 = 0;
    do {
      sVar2 = rsizes[rings - 1];
      lVar14 = ~uVar9 + uVar1 + sVar2;
      secp256k1_scalar_get_b32(&local_24a8,s + lVar14);
      lVar4 = 0;
      do {
        (&local_24a8)[lVar4] = (&local_24a8)[lVar4] ^ puVar12[lVar4 + sVar2 * 0x20];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x20);
      bVar16 = true;
      if ((((char)local_24a8 < '\0') && (local_2498 == auStack_2490[0])) &&
         (uStack_24a0 == local_2498)) {
        lVar4 = 0x18;
        uVar7 = 0;
        do {
          uVar7 = (ulong)(&local_24a8)[lVar4] | uVar7 << 8;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
        *v = uVar7;
        local_1038[lVar14 + -0x80].d[2] = local_2498;
        local_1038[lVar14 + -0x80].d[3] = auStack_2490[0];
        *(ulong *)(local_2038 + lVar14 * 0x20) = CONCAT71(uStack_24a7,local_24a8);
        auStack_2030[lVar14 * 4] = uStack_24a0;
        bVar16 = false;
      }
      if (!bVar16) goto LAB_00142759;
      puVar12 = puVar12 + -0x20;
      bVar16 = uVar9 == 0;
      uVar9 = uVar9 + 1;
    } while (bVar16);
    uVar9 = 2;
LAB_00142759:
    if (uVar9 < 2) {
      sVar2 = rsizes[rings - 1];
      uVar5 = (ulong)((uint)(uVar7 >> ((char)(rings - 1) * '\x02' & 0x3fU)) & 3);
      if (~uVar9 + sVar2 != uVar5) {
        uVar5 = uVar5 | uVar1;
        secp256k1_scalar_negate(&local_2478,s + uVar5);
        secp256k1_scalar_add(&local_2478,&local_2478,local_1038 + uVar5);
        secp256k1_scalar_inverse(&local_2458,ev + uVar5);
        secp256k1_scalar_mul(&local_2478,&local_2478,&local_2458);
        r = local_2438 + (rings - 1);
        secp256k1_scalar_negate(r,r);
        secp256k1_scalar_add(blind,&local_2478,r);
        if ((mlen == (size_t *)0x0 || local_2480 == (uchar *)0x0) || (*mlen == 0)) {
          if (mlen == (size_t *)0x0) {
            return 1;
          }
          *mlen = 0;
          return 1;
        }
        if (rings == 0) {
          uVar11 = 0;
        }
        else {
          uVar15 = 0;
          sVar8 = 0;
          uVar11 = 0;
          do {
            if (rsizes[sVar8] != 0) {
              puVar13 = local_2038 + uVar15 * 0x20;
              uVar6 = 0;
              uVar10 = uVar11;
              do {
                uVar11 = uVar10;
                if ((uVar15 != ~uVar9 + sVar2 + uVar1) && (uVar15 != uVar5)) {
                  if (((uint)(uVar7 >> ((char)sVar8 * '\x02' & 0x3fU)) & 3) == uVar6) {
                    secp256k1_scalar_mul(&local_2458,local_2438 + sVar8,ev + uVar15);
                    secp256k1_scalar_add(&local_2478,s + uVar15,&local_2458);
                  }
                  else {
                    local_2478.d[0] = s[uVar15].d[0];
                    local_2478.d[1] = s[uVar15].d[1];
                    local_2478.d[2] = s[uVar15].d[2];
                    local_2478.d[3] = (s[uVar15].d + 2)[1];
                  }
                  secp256k1_scalar_get_b32(&local_24a8,&local_2478);
                  lVar4 = 0;
                  do {
                    (&local_24a8)[lVar4] = (&local_24a8)[lVar4] ^ puVar13[lVar4];
                    lVar4 = lVar4 + 1;
                  } while (lVar4 != 0x20);
                  lVar4 = 0;
                  do {
                    uVar11 = lVar4 + uVar10;
                    if (*mlen <= uVar11) goto LAB_001429f6;
                    local_2480[lVar4 + uVar10] = (&local_24a8)[lVar4];
                    lVar4 = lVar4 + 1;
                  } while (lVar4 != 0x20);
                  uVar11 = uVar10 + 0x20;
                }
LAB_001429f6:
                uVar15 = uVar15 + 1;
                uVar6 = uVar6 + 1;
                puVar13 = puVar13 + 0x20;
                uVar10 = uVar11;
              } while (uVar6 < rsizes[sVar8]);
            }
            sVar8 = sVar8 + 1;
          } while (sVar8 != rings);
        }
        *mlen = uVar11;
        memset(local_2038,0,0x1000);
        memset(local_1038,0,0x1000);
        memset(local_2438,0,0x400);
        return 1;
      }
    }
    iVar3 = 0;
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_rewind_inner(secp256k1_scalar *blind, uint64_t *v,
 unsigned char *m, size_t *mlen, secp256k1_scalar *ev, secp256k1_scalar *s,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge *genp) {
    secp256k1_scalar s_orig[128];
    secp256k1_scalar sec[32];
    secp256k1_scalar stmp;
    unsigned char prep[4096];
    unsigned char tmp[32];
    uint64_t value = 0;
    size_t offset;
    size_t i;
    size_t j;
    int b;
    size_t skip1;
    size_t skip2;
    size_t npub;
    npub = ((rings - 1) << 2) + rsizes[rings-1];
    VERIFY_CHECK(npub <= 128);
    VERIFY_CHECK(npub >= 1);
    memset(prep, 0, 4096);
    /* Reconstruct the provers random values. */
    secp256k1_rangeproof_genrand(sec, s_orig, prep, rsizes, rings, nonce, commit, proof, len, genp);
    *v = UINT64_MAX;
    secp256k1_scalar_clear(blind);
    if (rings == 1 && rsizes[0] == 1) {
        /* With only a single proof, we can only recover the blinding factor. */
        secp256k1_rangeproof_recover_x(blind, &s_orig[0], &ev[0], &s[0]);
        if (v) {
            *v = 0;
        }
        if (mlen) {
            *mlen = 0;
        }
        return 1;
    }
    npub = (rings - 1) << 2;
    for (j = 0; j < 2; j++) {
        size_t idx;
        /* Look for a value encoding in the last ring. */
        idx = npub + rsizes[rings - 1] - 1 - j;
        secp256k1_scalar_get_b32(tmp, &s[idx]);
        secp256k1_rangeproof_ch32xor(tmp, &prep[idx * 32]);
        if ((tmp[0] & 128) && (memcmp(&tmp[16], &tmp[24], 8) == 0) && (memcmp(&tmp[8], &tmp[16], 8) == 0)) {
            value = 0;
            for (i = 0; i < 8; i++) {
                value = (value << 8) + tmp[24 + i];
            }
            if (v) {
                *v = value;
            }
            memcpy(&prep[idx * 32], tmp, 32);
            break;
        }
    }
    if (j > 1) {
        /* Couldn't extract a value. */
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 = rsizes[rings - 1] - 1 - j;
    skip2 = ((value >> ((rings - 1) << 1)) & 3);
    if (skip1 == skip2) {
        /*Value is in wrong position.*/
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 += (rings - 1) << 2;
    skip2 += (rings - 1) << 2;
    /* Like in the rsize[] == 1 case, Having figured out which s is the one which was not forged, we can recover the blinding factor. */
    secp256k1_rangeproof_recover_x(&stmp, &s_orig[skip2], &ev[skip2], &s[skip2]);
    secp256k1_scalar_negate(&sec[rings - 1], &sec[rings - 1]);
    secp256k1_scalar_add(blind, &stmp, &sec[rings - 1]);
    if (!m || !mlen || *mlen == 0) {
        if (mlen) {
            *mlen = 0;
        }
        /* FIXME: cleanup in early out/failure cases. */
        return 1;
    }
    offset = 0;
    npub = 0;
    for (i = 0; i < rings; i++) {
        size_t idx;
        idx = (value >> (i << 1)) & 3;
        for (j = 0; j < rsizes[i]; j++) {
            if (npub == skip1 || npub == skip2) {
                npub++;
                continue;
            }
            if (idx == j) {
                /** For the non-forged signatures the signature is calculated instead of random, instead we recover the prover's nonces.
                 *  this could just as well recover the blinding factors and messages could be put there as is done for recovering the
                 *  blinding factor in the last ring, but it takes an inversion to recover x so it's faster to put the message data in k.
                 */
                secp256k1_rangeproof_recover_k(&stmp, &sec[i], &ev[npub], &s[npub]);
            } else {
                stmp = s[npub];
            }
            secp256k1_scalar_get_b32(tmp, &stmp);
            secp256k1_rangeproof_ch32xor(tmp, &prep[npub * 32]);
            for (b = 0; b < 32 && offset < *mlen; b++) {
                m[offset] = tmp[b];
                offset++;
            }
            npub++;
        }
    }
    *mlen = offset;
    memset(prep, 0, 4096);
    for (i = 0; i < 128; i++) {
        secp256k1_scalar_clear(&s_orig[i]);
    }
    for (i = 0; i < 32; i++) {
        secp256k1_scalar_clear(&sec[i]);
    }
    secp256k1_scalar_clear(&stmp);
    return 1;
}